

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::statement<char_const(&)[62]>(CompilerGLSL *this,char (*ts) [62])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  size_t len;
  char (*ts_00) [62];
  uint uVar2;
  string local_48;
  
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_00 = this->redirect_statement;
    if (this_00 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      if (this->indent != 0) {
        uVar2 = 0;
        do {
          StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->indent);
      }
      len = strlen(*ts);
      StringStream<4096UL,_4096UL>::append(&this->buffer,*ts,len);
      this->statement_count = this->statement_count + 1;
      local_48._M_dataplus._M_p._0_1_ = 10;
      StringStream<4096UL,_4096UL>::append(&this->buffer,(char *)&local_48,1);
      return;
    }
    join<char_const(&)[62]>(&local_48,(spirv_cross *)ts,ts_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_));
    }
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}